

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_to_bytes(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,uchar *bytes_out,size_t len,
               size_t *written,_Bool is_elements)

{
  wally_tx_witness_stack *pwVar1;
  wally_tx_witness_item *pwVar2;
  wally_tx_input *pwVar3;
  wally_tx_output *pwVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  _Bool _Var9;
  bool bVar10;
  leint32_t tmp;
  int iVar11;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  size_t *bytes;
  size_t sVar17;
  size_t sVar18;
  uint32_t *puVar19;
  uint32_t *puVar20;
  uint64_t uVar21;
  uint64_t *bytes_out_00;
  uchar *puVar22;
  ulong uVar23;
  ulong uVar24;
  size_t *psVar25;
  uchar *puVar26;
  byte bVar27;
  long lVar28;
  uint64_t uVar29;
  size_t sVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  char local_49c;
  ulong local_478;
  ulong local_470;
  size_t local_460;
  uint local_454;
  size_t local_450;
  uint32_t *local_448;
  size_t n;
  size_t witness_count;
  
  if (opts == (tx_serialize_opts *)0x0) {
    bVar31 = true;
    bVar32 = false;
    bVar27 = 0;
    bVar33 = false;
  }
  else {
    uVar12 = opts->sighash;
    bVar27 = (byte)(uVar12 >> 7) & 1;
    bVar31 = (uVar12 & 0x40) == 0;
    bVar32 = (uVar12 & 0x1f) == 2;
    bVar33 = (uVar12 & 0x1f) == 3;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var9 = is_valid_tx(tx);
  if (!_Var9) {
    return -2;
  }
  if ((bytes_out == (uchar *)0x0 || written == (size_t *)0x0) || 0xf < flags) {
    return -2;
  }
  iVar11 = tx_get_length(tx,opts,flags,&n,is_elements);
  if (iVar11 != 0) {
    return -2;
  }
  if ((opts != (tx_serialize_opts *)0x0 & (byte)flags) != 0) {
    return -1;
  }
  if ((flags & 4) == 0) {
    if (tx->num_inputs == 0) {
      return -2;
    }
    if (tx->num_outputs == 0) {
      return -2;
    }
  }
  else if ((tx->num_inputs == 0) && (bVar10 = flags < 8, flags = 0, bVar10)) {
    return -2;
  }
  if (len < n) {
LAB_00104c6e:
    *written = n;
    return 0;
  }
  if ((opts == (tx_serialize_opts *)0x0) || (opts->bip143 != true)) {
    if ((flags & 1) != 0) {
      iVar11 = wally_tx_get_witness_count(tx,&witness_count);
      if (iVar11 != 0) {
        return -2;
      }
      if (witness_count == 0) {
        flags = 0;
      }
    }
    *(uint32_t *)bytes_out = tx->version;
    puVar22 = bytes_out + 4;
    if (is_elements) {
      if (opts == (tx_serialize_opts *)0x0) {
        bytes_out[4] = (byte)flags & 1;
        puVar22 = bytes_out + 5;
      }
    }
    else if ((flags & 1) != 0) {
      bytes_out[4] = '\0';
      bytes_out[5] = '\x01';
      puVar22 = bytes_out + 6;
    }
    if (bVar27 == 0) {
      sVar30 = varint_to_bytes(tx->num_inputs,puVar22);
      puVar22 = puVar22 + sVar30;
    }
    else {
      *puVar22 = '\x01';
      puVar22 = puVar22 + 1;
    }
    local_454 = CONCAT31(local_454._1_3_,bVar32 | bVar33);
    lVar28 = 0;
    bVar10 = !is_elements;
    for (uVar14 = 0; uVar14 < tx->num_inputs; uVar14 = uVar14 + 1) {
      pwVar3 = tx->inputs;
      puVar26 = pwVar3->txhash + lVar28;
      if (bVar27 == 0) {
        uVar5 = *(undefined8 *)puVar26;
        uVar6 = *(undefined8 *)(puVar26 + 8);
        uVar7 = *(undefined8 *)(puVar26 + 0x18);
        *(undefined8 *)(puVar22 + 0x10) = *(undefined8 *)(puVar26 + 0x10);
        *(undefined8 *)(puVar22 + 0x18) = uVar7;
        *(undefined8 *)puVar22 = uVar5;
        *(undefined8 *)(puVar22 + 8) = uVar6;
        if (opts != (tx_serialize_opts *)0x0) goto LAB_00104a40;
        if ((pwVar3->blinding_nonce[lVar28 + -1] & 2) == 0) {
          uVar12 = (pwVar3->blinding_nonce[lVar28 + -1] & 4) << 0x1c |
                   *(uint *)(pwVar3->txhash + lVar28 + 0x20);
        }
        else {
          uVar12 = *(uint *)(pwVar3->txhash + lVar28 + 0x20) | 0x80000000;
        }
        *(uint *)(puVar22 + 0x20) = uVar12;
        sVar30 = varbuff_to_bytes(*(uchar **)(pwVar3->blinding_nonce + lVar28 + -0x19),
                                  *(size_t *)(pwVar3->blinding_nonce + lVar28 + -0x11),
                                  puVar22 + 0x24);
        puVar26 = puVar22 + sVar30 + 0x24;
LAB_00104ab8:
        if (((local_454 & 1) == 0) || (uVar13 = 0, uVar14 == opts->index)) {
          uVar13 = *(undefined4 *)(pwVar3->blinding_nonce + lVar28 + -0x1d);
        }
        *(undefined4 *)puVar26 = uVar13;
        puVar22 = puVar26 + 4;
        if ((pwVar3->blinding_nonce[lVar28 + -1] & 2) == 0 || bVar10) {
          if ((pwVar3->blinding_nonce[lVar28 + -1] & 2) != 0) {
            return -2;
          }
        }
        else {
          uVar5 = *(undefined8 *)(pwVar3->blinding_nonce + lVar28);
          uVar6 = *(undefined8 *)(pwVar3->blinding_nonce + lVar28 + 8);
          uVar7 = *(undefined8 *)(pwVar3->blinding_nonce + lVar28 + 0x10 + 8);
          *(undefined8 *)(puVar26 + 0x14) = *(undefined8 *)(pwVar3->blinding_nonce + lVar28 + 0x10);
          *(undefined8 *)(puVar26 + 0x1c) = uVar7;
          *(undefined8 *)puVar22 = uVar5;
          *(undefined8 *)(puVar26 + 0xc) = uVar6;
          uVar5 = *(undefined8 *)(pwVar3->entropy + lVar28);
          uVar6 = *(undefined8 *)(pwVar3->entropy + lVar28 + 8);
          uVar7 = *(undefined8 *)(pwVar3->entropy + lVar28 + 0x10 + 8);
          *(undefined8 *)(puVar26 + 0x34) = *(undefined8 *)(pwVar3->entropy + lVar28 + 0x10);
          *(undefined8 *)(puVar26 + 0x3c) = uVar7;
          *(undefined8 *)(puVar26 + 0x24) = uVar5;
          *(undefined8 *)(puVar26 + 0x2c) = uVar6;
          sVar30 = confidential_value_to_bytes
                             (*(uchar **)(pwVar3->entropy + lVar28 + 0x27),
                              *(size_t *)(pwVar3->entropy + lVar28 + 0x2f),puVar26 + 0x44);
          sVar17 = confidential_value_to_bytes
                             (*(uchar **)(pwVar3->entropy + lVar28 + 0x37),
                              *(size_t *)(pwVar3->entropy + lVar28 + 0x3f),puVar26 + sVar30 + 0x44);
          puVar22 = puVar26 + sVar30 + 0x44 + sVar17;
        }
      }
      else if (uVar14 == opts->index) {
        uVar5 = *(undefined8 *)puVar26;
        uVar6 = *(undefined8 *)(puVar26 + 8);
        uVar7 = *(undefined8 *)(puVar26 + 0x18);
        *(undefined8 *)(puVar22 + 0x10) = *(undefined8 *)(puVar26 + 0x10);
        *(undefined8 *)(puVar22 + 0x18) = uVar7;
        *(undefined8 *)puVar22 = uVar5;
        *(undefined8 *)(puVar22 + 8) = uVar6;
LAB_00104a40:
        *(undefined4 *)(puVar22 + 0x20) = *(undefined4 *)(pwVar3->txhash + lVar28 + 0x20);
        if (uVar14 == opts->index) {
          sVar30 = varbuff_to_bytes(opts->script,opts->script_len,puVar22 + 0x24);
          puVar26 = puVar22 + 0x24 + sVar30;
        }
        else {
          puVar22[0x24] = '\0';
          puVar26 = puVar22 + 0x25;
        }
        goto LAB_00104ab8;
      }
      lVar28 = lVar28 + 0xd0;
    }
    if (bVar32 == false) {
      if (bVar33 == false) {
        uVar21 = tx->num_outputs;
      }
      else {
        uVar21 = opts->index + 1;
      }
      lVar28 = 0x68;
      sVar30 = varint_to_bytes(uVar21,puVar22);
      puVar20 = (uint32_t *)(puVar22 + sVar30);
      for (uVar29 = 0; uVar21 != uVar29; uVar29 = uVar29 + 1) {
        pwVar4 = tx->outputs;
        if ((bVar33 == false) || (uVar29 == opts->index)) {
          if ((*(byte *)((long)pwVar4 + lVar28 + -0x50) & 1) == 0) {
            *(undefined8 *)puVar20 = *(undefined8 *)((long)pwVar4 + lVar28 + -0x68);
            puVar20 = puVar20 + 2;
          }
          else {
            if (!is_elements) {
              return -2;
            }
            sVar30 = confidential_value_to_bytes
                               (*(uchar **)((long)pwVar4 + lVar28 + -0x48),
                                *(size_t *)((long)pwVar4 + lVar28 + -0x40),(uchar *)puVar20);
            sVar17 = confidential_value_to_bytes
                               (*(uchar **)((long)pwVar4 + lVar28 + -0x38),
                                *(size_t *)((long)pwVar4 + lVar28 + -0x30),
                                (uchar *)(sVar30 + (long)puVar20));
            puVar22 = (uchar *)(sVar30 + (long)puVar20) + sVar17;
            sVar30 = confidential_value_to_bytes
                               (*(uchar **)((long)pwVar4 + lVar28 + -0x28),
                                *(size_t *)((long)pwVar4 + lVar28 + -0x20),puVar22);
            puVar20 = (uint32_t *)(puVar22 + sVar30);
          }
          sVar30 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar28 + -0x60),
                                    *(size_t *)((long)pwVar4 + lVar28 + -0x58),(uchar *)puVar20);
          puVar20 = (uint32_t *)(sVar30 + (long)puVar20);
          if (!(bool)(bVar31 | bVar10)) {
            sVar30 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar28 + -8),
                                      *(size_t *)((long)&pwVar4->satoshi + lVar28),(uchar *)puVar20)
            ;
            sVar17 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar28 + -0x18),
                                      *(size_t *)((long)pwVar4 + lVar28 + -0x10),
                                      (uchar *)(sVar30 + (long)puVar20));
            puVar20 = (uint32_t *)((uchar *)(sVar30 + (long)puVar20) + sVar17);
          }
        }
        else {
          *(undefined1 *)(puVar20 + 2) = 0;
          puVar20[0] = 0xffffffff;
          puVar20[1] = 0xffffffff;
          puVar20 = (uint32_t *)((long)puVar20 + 9);
        }
        lVar28 = lVar28 + 0x70;
      }
    }
    else {
      *puVar22 = '\0';
      puVar20 = (uint32_t *)(puVar22 + 1);
    }
    if ((flags & 1) != 0 && !is_elements) {
      for (uVar14 = 0; uVar14 < tx->num_inputs; uVar14 = uVar14 + 1) {
        pwVar3 = tx->inputs;
        pwVar1 = pwVar3[uVar14].witness;
        if (pwVar1 == (wally_tx_witness_stack *)0x0) {
          uVar21 = 0;
        }
        else {
          uVar21 = pwVar1->num_items;
        }
        sVar30 = varint_to_bytes(uVar21,(uchar *)puVar20);
        puVar20 = (uint32_t *)((long)puVar20 + sVar30);
        lVar28 = 8;
        while (bVar32 = uVar21 != 0, uVar21 = uVar21 - 1, bVar32) {
          pwVar2 = (pwVar3[uVar14].witness)->items;
          sVar30 = varbuff_to_bytes(*(uchar **)((long)pwVar2 + lVar28 + -8),
                                    *(size_t *)((long)&pwVar2->witness + lVar28),(uchar *)puVar20);
          puVar20 = (uint32_t *)((long)puVar20 + sVar30);
          lVar28 = lVar28 + 0x10;
        }
      }
    }
    puVar19 = puVar20 + 1;
    *puVar20 = tx->locktime;
    if (opts != (tx_serialize_opts *)0x0) {
      *puVar19 = opts->tx_sighash;
    }
    if ((flags & 1) != 0 && !bVar10) {
      for (uVar14 = 0; uVar14 < tx->num_inputs; uVar14 = uVar14 + 1) {
        pwVar3 = tx->inputs;
        sVar30 = varbuff_to_bytes(pwVar3[uVar14].issuance_amount_rangeproof,
                                  pwVar3[uVar14].issuance_amount_rangeproof_len,(uchar *)puVar19);
        sVar17 = varbuff_to_bytes(pwVar3[uVar14].inflation_keys_rangeproof,
                                  pwVar3[uVar14].inflation_keys_rangeproof_len,
                                  (uchar *)(sVar30 + (long)puVar19));
        if (pwVar3[uVar14].witness == (wally_tx_witness_stack *)0x0) {
          uVar21 = 0;
        }
        else {
          uVar21 = (pwVar3[uVar14].witness)->num_items;
        }
        puVar22 = (uchar *)(sVar30 + (long)puVar19) + sVar17;
        sVar30 = varint_to_bytes(uVar21,puVar22);
        puVar22 = puVar22 + sVar30;
        lVar28 = 8;
        while (bVar32 = uVar21 != 0, uVar21 = uVar21 - 1, bVar32) {
          pwVar2 = (pwVar3[uVar14].witness)->items;
          sVar30 = varbuff_to_bytes(*(uchar **)((long)pwVar2 + lVar28 + -8),
                                    *(size_t *)((long)&pwVar2->witness + lVar28),puVar22);
          puVar22 = puVar22 + sVar30;
          lVar28 = lVar28 + 0x10;
        }
        if (pwVar3[uVar14].pegin_witness == (wally_tx_witness_stack *)0x0) {
          sVar30 = 0;
        }
        else {
          sVar30 = (pwVar3[uVar14].pegin_witness)->num_items;
        }
        sVar17 = varint_to_bytes(sVar30,puVar22);
        puVar19 = (uint32_t *)(puVar22 + sVar17);
        lVar28 = 8;
        while (bVar32 = sVar30 != 0, sVar30 = sVar30 - 1, bVar32) {
          pwVar2 = (pwVar3[uVar14].pegin_witness)->items;
          sVar17 = varbuff_to_bytes(*(uchar **)((long)pwVar2 + lVar28 + -8),
                                    *(size_t *)((long)&pwVar2->witness + lVar28),(uchar *)puVar19);
          puVar19 = (uint32_t *)((long)puVar19 + sVar17);
          lVar28 = lVar28 + 0x10;
        }
      }
      lVar28 = 0x68;
      for (uVar14 = 0; uVar14 < tx->num_outputs; uVar14 = uVar14 + 1) {
        pwVar4 = tx->outputs;
        sVar30 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar28 + -0x18),
                                  *(size_t *)((long)pwVar4 + lVar28 + -0x10),(uchar *)puVar19);
        sVar17 = varbuff_to_bytes(*(uchar **)((long)pwVar4 + lVar28 + -8),
                                  *(size_t *)((long)&pwVar4->satoshi + lVar28),
                                  (uchar *)(sVar30 + (long)puVar19));
        puVar19 = (uint32_t *)((uchar *)(sVar30 + (long)puVar19) + sVar17);
        lVar28 = lVar28 + 0x70;
      }
    }
    goto LAB_00104c6e;
  }
  local_460 = 0;
  uVar12 = opts->sighash;
  iVar11 = wally_tx_is_elements(tx,&local_460);
  if (iVar11 != 0) {
    return iVar11;
  }
  local_454 = uVar12 & 0x1f;
  *(uint32_t *)bytes_out = tx->version;
  uVar14 = tx->num_inputs * 0x24;
  if (local_454 == 2) {
    local_478 = 0;
    local_470 = 0;
  }
  else if (local_454 == 3) {
    uVar23 = opts->index;
    if (uVar23 < tx->num_outputs) {
      if (local_460 == 0) {
        sVar30 = varbuff_get_length(tx->outputs[uVar23].script_len);
        local_470 = sVar30 + 8;
      }
      else {
        sVar30 = confidential_asset_length_from_bytes(tx->outputs[uVar23].asset);
        sVar17 = confidential_value_length_from_bytes(tx->outputs[opts->index].value);
        sVar18 = confidential_nonce_length_from_bytes(tx->outputs[opts->index].nonce);
        sVar15 = varbuff_get_length(tx->outputs[opts->index].script_len);
        local_470 = sVar15 + sVar18 + sVar17 + sVar30;
        if ((uVar12 & 0x40) != 0) {
          sVar30 = varbuff_get_length(tx->outputs[opts->index].rangeproof_len);
          sVar17 = varbuff_get_length(tx->outputs[opts->index].surjectionproof_len);
          local_478 = sVar17 + sVar30;
          goto LAB_001050cd;
        }
      }
      local_478 = 0;
    }
    else {
      local_478 = 0;
      local_470 = 0;
    }
  }
  else {
    lVar28 = 0;
    local_478 = 0;
    local_470 = 0;
    for (uVar23 = 0; uVar23 < tx->num_outputs; uVar23 = uVar23 + 1) {
      if (local_460 == 0) {
        lVar16 = 8;
      }
      else {
        sVar30 = confidential_asset_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->asset + lVar28));
        sVar17 = confidential_value_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->value + lVar28));
        sVar18 = confidential_nonce_length_from_bytes
                           (*(uchar **)((long)&tx->outputs->nonce + lVar28));
        lVar16 = sVar18 + sVar17 + sVar30;
        if ((uVar12 & 0x40) != 0) {
          sVar30 = varbuff_get_length(*(size_t *)((long)&tx->outputs->rangeproof_len + lVar28));
          sVar17 = varbuff_get_length(*(size_t *)((long)&tx->outputs->surjectionproof_len + lVar28))
          ;
          local_478 = sVar30 + local_478 + sVar17;
        }
      }
      sVar30 = varbuff_get_length(*(size_t *)((long)&tx->outputs->script_len + lVar28));
      local_470 = sVar30 + lVar16 + local_470;
      lVar28 = lVar28 + 0x70;
    }
  }
LAB_001050cd:
  local_49c = (char)uVar12;
  if (local_460 == 0 || local_49c < '\0') {
    uVar23 = 0;
  }
  else {
    lVar28 = 0;
    uVar23 = 0;
    for (uVar24 = 0; uVar24 < tx->num_inputs; uVar24 = uVar24 + 1) {
      lVar16 = 1;
      if ((tx->inputs->blinding_nonce[lVar28 + -1] & 2) != 0) {
        sVar30 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar28 + 0x27));
        sVar17 = confidential_value_length_from_bytes
                           (*(uchar **)(tx->inputs->entropy + lVar28 + 0x37));
        lVar16 = sVar17 + sVar30 + 0x40;
      }
      uVar23 = uVar23 + lVar16;
      lVar28 = lVar28 + 0xd0;
    }
  }
  if ((((uVar14 < 0x401) && (local_470 < 0x401)) && (local_478 < 0x401)) && (uVar23 < 0x401)) {
    bytes = &witness_count;
    sVar30 = 0x400;
  }
  else {
    sVar30 = local_470;
    if (local_470 < uVar14) {
      sVar30 = uVar14;
    }
    if (sVar30 <= local_478) {
      sVar30 = local_478;
    }
    if (sVar30 <= uVar23) {
      sVar30 = uVar23;
    }
    bytes = (size_t *)wally_malloc(sVar30);
    if (bytes == (size_t *)0x0) {
      return -3;
    }
  }
  puVar22 = bytes_out + 4;
  if (local_49c < '\0') {
    bytes_out[0x14] = '\0';
    bytes_out[0x15] = '\0';
    bytes_out[0x16] = '\0';
    bytes_out[0x17] = '\0';
    bytes_out[0x18] = '\0';
    bytes_out[0x19] = '\0';
    bytes_out[0x1a] = '\0';
    bytes_out[0x1b] = '\0';
    bytes_out[0x1c] = '\0';
    bytes_out[0x1d] = '\0';
    bytes_out[0x1e] = '\0';
    bytes_out[0x1f] = '\0';
    bytes_out[0x20] = '\0';
    bytes_out[0x21] = '\0';
    bytes_out[0x22] = '\0';
    bytes_out[0x23] = '\0';
    puVar22[0] = '\0';
    puVar22[1] = '\0';
    puVar22[2] = '\0';
    puVar22[3] = '\0';
    puVar22[4] = '\0';
    puVar22[5] = '\0';
    puVar22[6] = '\0';
    puVar22[7] = '\0';
    bytes_out[0xc] = '\0';
    bytes_out[0xd] = '\0';
    bytes_out[0xe] = '\0';
    bytes_out[0xf] = '\0';
    bytes_out[0x10] = '\0';
    bytes_out[0x11] = '\0';
    bytes_out[0x12] = '\0';
    bytes_out[0x13] = '\0';
LAB_001051ed:
    bytes_out[0x34] = '\0';
    bytes_out[0x35] = '\0';
    bytes_out[0x36] = '\0';
    bytes_out[0x37] = '\0';
    bytes_out[0x38] = '\0';
    bytes_out[0x39] = '\0';
    bytes_out[0x3a] = '\0';
    bytes_out[0x3b] = '\0';
    bytes_out[0x3c] = '\0';
    bytes_out[0x3d] = '\0';
    bytes_out[0x3e] = '\0';
    bytes_out[0x3f] = '\0';
    bytes_out[0x40] = '\0';
    bytes_out[0x41] = '\0';
    bytes_out[0x42] = '\0';
    bytes_out[0x43] = '\0';
    bytes_out[0x24] = '\0';
    bytes_out[0x25] = '\0';
    bytes_out[0x26] = '\0';
    bytes_out[0x27] = '\0';
    bytes_out[0x28] = '\0';
    bytes_out[0x29] = '\0';
    bytes_out[0x2a] = '\0';
    bytes_out[0x2b] = '\0';
    bytes_out[0x2c] = '\0';
    bytes_out[0x2d] = '\0';
    bytes_out[0x2e] = '\0';
    bytes_out[0x2f] = '\0';
    bytes_out[0x30] = '\0';
    bytes_out[0x31] = '\0';
    bytes_out[0x32] = '\0';
    bytes_out[0x33] = '\0';
  }
  else {
    psVar25 = bytes + 4;
    lVar28 = 0;
    for (uVar24 = 0; uVar24 < tx->num_inputs; uVar24 = uVar24 + 1) {
      puVar26 = tx->inputs->txhash + lVar28;
      sVar17 = *(size_t *)puVar26;
      sVar18 = *(size_t *)(puVar26 + 8);
      puVar26 = tx->inputs->txhash + lVar28 + 0x10;
      sVar15 = *(size_t *)(puVar26 + 8);
      psVar25[-2] = *(size_t *)puVar26;
      psVar25[-1] = sVar15;
      psVar25[-4] = sVar17;
      psVar25[-3] = sVar18;
      *(undefined4 *)psVar25 = *(undefined4 *)(tx->inputs->txhash + lVar28 + 0x20);
      lVar28 = lVar28 + 0xd0;
      psVar25 = (size_t *)((long)psVar25 + 0x24);
    }
    iVar11 = wally_sha256d((uchar *)bytes,uVar14,puVar22,0x20);
    if (iVar11 != 0) goto LAB_0010576f;
    if ((uVar12 & 0x1e) == 2) goto LAB_001051ed;
    lVar28 = 9;
    for (uVar14 = 0; uVar14 < tx->num_inputs; uVar14 = uVar14 + 1) {
      *(undefined4 *)((long)bytes + uVar14 * 4) = *(undefined4 *)(tx->inputs->txhash + lVar28 * 4);
      lVar28 = lVar28 + 0x34;
    }
    iVar11 = wally_sha256d((uchar *)bytes,tx->num_inputs << 2,bytes_out + 0x24,0x20);
    if (iVar11 != 0) goto LAB_0010576f;
  }
  puVar22 = bytes_out + 0x44;
  if (local_460 != 0) {
    if (local_49c < '\0') {
      bytes_out[0x54] = '\0';
      bytes_out[0x55] = '\0';
      bytes_out[0x56] = '\0';
      bytes_out[0x57] = '\0';
      bytes_out[0x58] = '\0';
      bytes_out[0x59] = '\0';
      bytes_out[0x5a] = '\0';
      bytes_out[0x5b] = '\0';
      bytes_out[0x5c] = '\0';
      bytes_out[0x5d] = '\0';
      bytes_out[0x5e] = '\0';
      bytes_out[0x5f] = '\0';
      bytes_out[0x60] = '\0';
      bytes_out[0x61] = '\0';
      bytes_out[0x62] = '\0';
      bytes_out[99] = '\0';
      puVar22[0] = '\0';
      puVar22[1] = '\0';
      puVar22[2] = '\0';
      puVar22[3] = '\0';
      puVar22[4] = '\0';
      puVar22[5] = '\0';
      puVar22[6] = '\0';
      puVar22[7] = '\0';
      bytes_out[0x4c] = '\0';
      bytes_out[0x4d] = '\0';
      bytes_out[0x4e] = '\0';
      bytes_out[0x4f] = '\0';
      bytes_out[0x50] = '\0';
      bytes_out[0x51] = '\0';
      bytes_out[0x52] = '\0';
      bytes_out[0x53] = '\0';
    }
    else {
      lVar28 = 0;
      psVar25 = bytes;
      local_450 = sVar30;
      for (uVar14 = 0; uVar14 < tx->num_inputs; uVar14 = uVar14 + 1) {
        pwVar3 = tx->inputs;
        if ((pwVar3->blinding_nonce[lVar28 + -1] & 2) == 0) {
          *(undefined1 *)psVar25 = 0;
          psVar25 = (size_t *)((long)psVar25 + 1);
        }
        else {
          sVar30 = *(size_t *)(pwVar3->blinding_nonce + lVar28);
          sVar17 = *(size_t *)(pwVar3->blinding_nonce + lVar28 + 8);
          sVar18 = *(size_t *)(pwVar3->blinding_nonce + lVar28 + 0x10 + 8);
          psVar25[2] = *(size_t *)(pwVar3->blinding_nonce + lVar28 + 0x10);
          psVar25[3] = sVar18;
          *psVar25 = sVar30;
          psVar25[1] = sVar17;
          puVar26 = tx->inputs->entropy + lVar28;
          sVar30 = *(size_t *)puVar26;
          sVar17 = *(size_t *)(puVar26 + 8);
          puVar26 = tx->inputs->entropy + lVar28 + 0x10;
          sVar18 = *(size_t *)(puVar26 + 8);
          psVar25[6] = *(size_t *)puVar26;
          psVar25[7] = sVar18;
          psVar25[4] = sVar30;
          psVar25[5] = sVar17;
          sVar30 = confidential_value_to_bytes
                             (*(uchar **)(tx->inputs->entropy + lVar28 + 0x27),
                              *(size_t *)(tx->inputs->entropy + lVar28 + 0x2f),
                              (uchar *)(psVar25 + 8));
          puVar26 = (uchar *)((long)psVar25 + sVar30 + 0x40);
          sVar30 = confidential_value_to_bytes
                             (*(uchar **)(tx->inputs->entropy + lVar28 + 0x37),
                              *(size_t *)(tx->inputs->entropy + lVar28 + 0x3f),puVar26);
          psVar25 = (size_t *)(puVar26 + sVar30);
        }
        lVar28 = lVar28 + 0xd0;
      }
      iVar11 = wally_sha256d((uchar *)bytes,uVar23,puVar22,0x20);
      sVar30 = local_450;
      if (iVar11 != 0) goto LAB_0010576f;
    }
    puVar22 = bytes_out + 100;
  }
  pwVar3 = tx->inputs + opts->index;
  uVar5 = *(undefined8 *)pwVar3->txhash;
  uVar6 = *(undefined8 *)(pwVar3->txhash + 8);
  puVar26 = tx->inputs[opts->index].txhash + 0x10;
  uVar7 = *(undefined8 *)(puVar26 + 8);
  *(undefined8 *)(puVar22 + 0x10) = *(undefined8 *)puVar26;
  *(undefined8 *)(puVar22 + 0x18) = uVar7;
  *(undefined8 *)puVar22 = uVar5;
  *(undefined8 *)(puVar22 + 8) = uVar6;
  *(uint32_t *)(puVar22 + 0x20) = tx->inputs[opts->index].index;
  sVar17 = varbuff_to_bytes(opts->script,opts->script_len,puVar22 + 0x24);
  bytes_out_00 = (uint64_t *)(puVar22 + sVar17 + 0x24);
  if (local_460 == 0) {
    *bytes_out_00 = opts->satoshi;
    sVar17 = 8;
    bVar32 = true;
  }
  else {
    sVar17 = confidential_value_to_bytes(opts->value,opts->value_len,(uchar *)bytes_out_00);
    bVar32 = local_460 == 0;
  }
  puVar20 = (uint32_t *)((long)bytes_out_00 + sVar17);
  puVar19 = puVar20 + 1;
  *puVar20 = tx->inputs[opts->index].sequence;
  if (!bVar32) {
    pwVar3 = tx->inputs;
    sVar18 = opts->index;
    if ((pwVar3[sVar18].features & 2) != 0) {
      uVar5 = *(undefined8 *)pwVar3[sVar18].blinding_nonce;
      uVar6 = *(undefined8 *)(pwVar3[sVar18].blinding_nonce + 8);
      uVar7 = *(undefined8 *)(pwVar3[sVar18].blinding_nonce + 0x18);
      *(undefined8 *)(puVar20 + 5) = *(undefined8 *)(pwVar3[sVar18].blinding_nonce + 0x10);
      *(undefined8 *)(puVar20 + 7) = uVar7;
      *(undefined8 *)puVar19 = uVar5;
      *(undefined8 *)(puVar20 + 3) = uVar6;
      puVar22 = tx->inputs[opts->index].entropy;
      uVar5 = *(undefined8 *)puVar22;
      uVar6 = *(undefined8 *)(puVar22 + 8);
      puVar22 = tx->inputs[opts->index].entropy + 0x10;
      uVar7 = *(undefined8 *)(puVar22 + 8);
      *(undefined8 *)((long)bytes_out_00 + sVar17 + 0x34) = *(undefined8 *)puVar22;
      *(undefined8 *)((long)bytes_out_00 + sVar17 + 0x3c) = uVar7;
      *(undefined8 *)((long)bytes_out_00 + sVar17 + 0x24) = uVar5;
      *(undefined8 *)((long)bytes_out_00 + sVar17 + 0x2c) = uVar6;
      sVar18 = confidential_value_to_bytes
                         (tx->inputs[opts->index].issuance_amount,
                          tx->inputs[opts->index].issuance_amount_len,
                          (uchar *)((long)bytes_out_00 + sVar17 + 0x44));
      puVar22 = (uchar *)((long)bytes_out_00 + sVar18 + sVar17 + 0x44);
      sVar17 = confidential_value_to_bytes
                         (tx->inputs[opts->index].inflation_keys,
                          tx->inputs[opts->index].inflation_keys_len,puVar22);
      puVar19 = (uint32_t *)(puVar22 + sVar17);
    }
  }
  uVar8 = local_454;
  local_448 = puVar19;
  if ((local_454 == 2) || ((local_454 == 3 && (tx->num_outputs <= opts->index)))) {
    puVar19[4] = 0;
    puVar19[5] = 0;
    puVar19[6] = 0;
    puVar19[7] = 0;
    puVar19[0] = 0;
    puVar19[1] = 0;
    puVar19[2] = 0;
    puVar19[3] = 0;
  }
  else {
    lVar28 = 0;
    psVar25 = bytes;
    local_450 = sVar30;
    for (uVar14 = 0; puVar19 = local_448, uVar14 < tx->num_outputs; uVar14 = uVar14 + 1) {
      if ((uVar8 != 3) || (uVar14 == opts->index)) {
        pwVar4 = tx->outputs;
        if (local_460 == 0) {
          *psVar25 = *(size_t *)((long)&pwVar4->satoshi + lVar28);
          psVar25 = psVar25 + 1;
        }
        else {
          sVar30 = confidential_value_to_bytes
                             (*(uchar **)((long)&pwVar4->asset + lVar28),
                              *(size_t *)((long)&pwVar4->asset_len + lVar28),(uchar *)psVar25);
          sVar17 = confidential_value_to_bytes
                             (*(uchar **)((long)&tx->outputs->value + lVar28),
                              *(size_t *)((long)&tx->outputs->value_len + lVar28),
                              (uchar *)(sVar30 + (long)psVar25));
          puVar22 = (uchar *)(sVar30 + (long)psVar25) + sVar17;
          sVar30 = confidential_value_to_bytes
                             (*(uchar **)((long)&tx->outputs->nonce + lVar28),
                              *(size_t *)((long)&tx->outputs->nonce_len + lVar28),puVar22);
          psVar25 = (size_t *)(puVar22 + sVar30);
        }
        sVar30 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->script + lVar28),
                                  *(size_t *)((long)&tx->outputs->script_len + lVar28),
                                  (uchar *)psVar25);
        psVar25 = (size_t *)(sVar30 + (long)psVar25);
      }
      lVar28 = lVar28 + 0x70;
    }
    iVar11 = wally_sha256d((uchar *)bytes,local_470,(uchar *)local_448,0x20);
    sVar30 = local_450;
    if (iVar11 != 0) goto LAB_0010576f;
  }
  puVar20 = puVar19 + 8;
  if (local_460 != 0 && (uVar12 & 0x40) != 0) {
    if ((uVar8 == 2) || ((uVar8 == 3 && (tx->num_outputs <= opts->index)))) {
      puVar19[0xc] = 0;
      puVar19[0xd] = 0;
      puVar19[0xe] = 0;
      puVar19[0xf] = 0;
      puVar20[0] = 0;
      puVar20[1] = 0;
      puVar19[10] = 0;
      puVar19[0xb] = 0;
    }
    else {
      lVar28 = 0;
      psVar25 = bytes;
      local_450 = sVar30;
      for (uVar14 = 0; uVar14 < tx->num_outputs; uVar14 = uVar14 + 1) {
        if ((uVar8 != 3) || (uVar14 == opts->index)) {
          sVar30 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->rangeproof + lVar28),
                                    *(size_t *)((long)&tx->outputs->rangeproof_len + lVar28),
                                    (uchar *)psVar25);
          sVar17 = varbuff_to_bytes(*(uchar **)((long)&tx->outputs->surjectionproof + lVar28),
                                    *(size_t *)((long)&tx->outputs->surjectionproof_len + lVar28),
                                    (uchar *)(sVar30 + (long)psVar25));
          psVar25 = (size_t *)((uchar *)(sVar30 + (long)psVar25) + sVar17);
        }
        lVar28 = lVar28 + 0x70;
      }
      iVar11 = wally_sha256d((uchar *)bytes,local_478,(uchar *)puVar20,0x20);
      sVar30 = local_450;
      if (iVar11 != 0) goto LAB_0010576f;
    }
    puVar20 = local_448 + 0x10;
  }
  *puVar20 = tx->locktime;
  puVar20[1] = opts->tx_sighash;
  *written = (size_t)((long)puVar20 + (8 - (long)bytes_out));
  iVar11 = 0;
LAB_0010576f:
  if (bytes == &witness_count) {
    wally_clear(&witness_count,0x400);
    return iVar11;
  }
  clear_and_free(bytes,sVar30);
  return iVar11;
}

Assistant:

static int tx_to_bytes(const struct wally_tx *tx,
                       const struct tx_serialize_opts *opts,
                       uint32_t flags,
                       unsigned char *bytes_out, size_t len,
                       size_t *written,
                       bool is_elements)
{
    size_t n, i, j, witness_count;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
#ifdef BUILD_ELEMENTS
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
#endif
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;
    unsigned char *p = bytes_out;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) ||
        (flags & ~WALLY_TX_ALL_FLAGS) || !bytes_out || !written ||
        tx_get_length(tx, opts, flags, &n, is_elements) != WALLY_OK)
        return WALLY_EINVAL;

    if (opts && (flags & WALLY_TX_FLAG_USE_WITNESS))
        return WALLY_ERROR; /* Segwit tx hashing is handled elsewhere */

    if (!(flags & WALLY_TX_FLAG_ALLOW_PARTIAL)) {
        /* 0-input/output txs can be only be written with this flag */
        if (!tx->num_inputs || !tx->num_outputs)
            return WALLY_EINVAL;
    }

    if (!tx->num_inputs) {
        /* 0-input txs can only be written in the pre-BIP144 format,
         * since otherwise the resulting tx is ambiguous.
         * Used in PSBTs while building the tx for example.
         */
        if (!(flags & WALLY_TX_FLAG_PRE_BIP144))
            return WALLY_EINVAL;
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    if (n > len) {
        *written = n;
        return WALLY_OK;
    }

    if (opts && opts->bip143)
        return tx_to_bip143_bytes(tx, opts, flags, bytes_out, len, written);

    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (wally_tx_get_witness_count(tx, &witness_count) != WALLY_OK)
            return WALLY_EINVAL;
        if (!witness_count)
            flags &= ~WALLY_TX_FLAG_USE_WITNESS;
    }

    p += uint32_to_le_bytes(tx->version, p);
    if (is_elements) {
        if (!opts)
            *p++ = flags & WALLY_TX_FLAG_USE_WITNESS ? 1 : 0;
    } else {
        if (flags & WALLY_TX_FLAG_USE_WITNESS) {
            *p++ = 0; /* Write BIP 144 marker */
            *p++ = 1; /* Write BIP 144 flag */
        }
    }
    if (anyonecanpay)
        *p++ = 1;
    else
        p += varint_to_bytes(tx->num_inputs, p);

    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        memcpy(p, input->txhash, sizeof(input->txhash));
        p += sizeof(input->txhash);
        if (!opts && (input->features & WALLY_TX_IS_ISSUANCE))
            p += uint32_to_le_bytes(input->index | WALLY_TX_ISSUANCE_FLAG, p);
        else if (!opts && (input->features & WALLY_TX_IS_PEGIN))
            p += uint32_to_le_bytes(input->index | WALLY_TX_PEGIN_FLAG, p);
        else
            p += uint32_to_le_bytes(input->index, p);
        if (opts) {
            if (i == opts->index)
                p += varbuff_to_bytes(opts->script, opts->script_len, p);
            else
                *p++ = 0; /* Blank scripts for non-signing inputs */
        } else
            p += varbuff_to_bytes(input->script, input->script_len, p);

        if ((sh_none || sh_single) && i != opts->index)
            p += uint32_to_le_bytes(0, p);
        else
            p += uint32_to_le_bytes(input->sequence, p);
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            if (!is_elements)
                return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
            memcpy(p, input->blinding_nonce, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            memcpy(p, input->entropy, WALLY_TX_ASSET_TAG_LEN);
            p += WALLY_TX_ASSET_TAG_LEN;
            p += confidential_value_to_bytes(input->issuance_amount, input->issuance_amount_len, p);
            p += confidential_value_to_bytes(input->inflation_keys, input->inflation_keys_len, p);
#endif
        }
    }

    if (sh_none)
        *p++ = 0;
    else {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;
        p += varint_to_bytes(num_outputs, p);

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index) {
                memcpy(p, EMPTY_OUTPUT, sizeof(EMPTY_OUTPUT));
                p += sizeof(EMPTY_OUTPUT);
            } else {
                if (output->features & WALLY_TX_IS_ELEMENTS) {
                    if (!is_elements)
                        return WALLY_EINVAL;
#ifdef BUILD_ELEMENTS
                    p += confidential_value_to_bytes(output->asset, output->asset_len, p);
                    p += confidential_value_to_bytes(output->value, output->value_len, p);
                    p += confidential_value_to_bytes(output->nonce, output->nonce_len, p);
#endif
                } else {
                    p += uint64_to_le_bytes(output->satoshi, p);
                }
                p += varbuff_to_bytes(output->script, output->script_len, p);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    p += varbuff_to_bytes(output->rangeproof,
                                          output->rangeproof_len, p);
                    p += varbuff_to_bytes(output->surjectionproof,
                                          output->surjectionproof_len, p);
                }
#endif
            }
        }
    }

    if (!is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
    }

    p += uint32_to_le_bytes(tx->locktime, p);
    if (opts)
        uint32_to_le_bytes(opts->tx_sighash, p);

#ifdef BUILD_ELEMENTS
    if (is_elements && (flags & WALLY_TX_FLAG_USE_WITNESS)) {
        for (i = 0; i < tx->num_inputs; ++i) {
            const struct wally_tx_input *input = tx->inputs + i;
            size_t num_items;
            p += varbuff_to_bytes(input->issuance_amount_rangeproof, input->issuance_amount_rangeproof_len, p);
            p += varbuff_to_bytes(input->inflation_keys_rangeproof, input->inflation_keys_rangeproof_len, p);
            num_items = input->witness ? input->witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
            num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
            p += varint_to_bytes(num_items, p);
            for (j = 0; j < num_items; ++j) {
                const struct wally_tx_witness_item *stack;
                stack = input->pegin_witness->items + j;
                p += varbuff_to_bytes(stack->witness, stack->witness_len, p);
            }
        }
        for (i = 0; i < tx->num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            p += varbuff_to_bytes(output->surjectionproof, output->surjectionproof_len, p);
            p += varbuff_to_bytes(output->rangeproof, output->rangeproof_len, p);
        }
    }
#endif
    *written = n;
    return WALLY_OK;
}